

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

bool __thiscall
CUI::DoEditBox(CUI *this,CLineInput *pLineInput,CUIRect *pRect,float FontSize,int Corners,
              IButtonColorFunction *pColorFunction)

{
  bool bVar1;
  CLineInput *pCVar2;
  ITextRender *pIVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int End;
  uint uVar7;
  char *str;
  byte bVar8;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  anon_union_4_2_94730017_for_vector4_base<float>_7 extraout_XMM0_Db;
  anon_union_4_2_94730017_for_vector4_base<float>_7 extraout_XMM0_Db_00;
  anon_union_4_2_94730039_for_vector4_base<float>_5 in_XMM1_Da;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar9;
  anon_union_4_2_94730017_for_vector4_base<float>_7 in_XMM1_Db;
  float fVar10;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar11;
  CUIRect Textbox;
  uint local_90;
  float local_84;
  vec4 local_58;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_48;
  float local_44;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (pLineInput->m_TextCursor).m_FontSize = FontSize;
  (pLineInput->m_TextCursor).m_Align = 4;
  bVar4 = MouseHovered(this,pRect);
  pCVar2 = (CLineInput *)this->m_pLastActiveItem;
  bVar1 = pLineInput->m_WasChanged;
  pLineInput->m_WasChanged = false;
  str = CLineInput::GetDisplayedString(pLineInput);
  aVar11 = (anon_union_4_2_94730039_for_vector4_base<float>_5)pLineInput->m_ScrollOffset;
  CUIRect::VMargin(pRect,2.0,(CUIRect *)&local_48);
  if (pCVar2 != pLineInput) {
    bVar8 = 0;
    goto LAB_0018cdc3;
  }
  local_90 = pLineInput->m_CursorPos;
  if ((bVar4) && ((this->m_MouseButtons & 1) != 0 && bVar1 == false)) {
    DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\x01'
    ;
    DoEditBox::s_ScrollStartX = this->m_MouseX;
    iVar6 = 0;
    if (0 < pLineInput->m_NumChars) {
      fVar10 = DoEditBox::s_ScrollStartX - local_48.z;
      local_84 = 0.0;
      uVar7 = 0;
      do {
        iVar6 = iVar6 + 1;
        uVar5 = str_utf8_forward(str,uVar7);
        (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                  (FontSize,this->m_pTextRender,str,(ulong)uVar5);
        in_XMM1_Da.z = ((extraout_XMM0_Da - local_84) * 0.5 + local_84) - aVar11.z;
        if (fVar10 < in_XMM1_Da.z) {
LAB_0018ccc3:
          local_90 = uVar7;
          if (DoEditBox::s_SelectionStartOffset < 0) {
            DoEditBox::s_SelectionStartOffset = uVar7;
          }
        }
        else {
          local_84 = extraout_XMM0_Da;
          if (iVar6 == pLineInput->m_NumChars) {
            uVar7 = pLineInput->m_Len;
            goto LAB_0018ccc3;
          }
        }
        in_XMM1_Db = extraout_XMM0_Db;
      } while ((in_XMM1_Da.z <= fVar10) && (uVar7 = uVar5, iVar6 < pLineInput->m_NumChars));
    }
    bVar8 = 0;
  }
  else {
    if ((byte)((byte)this->m_MouseButtons & (bVar1 ^ 1U)) == 0) {
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\0'
      ;
      DoEditBox::s_SelectionStartOffset = -1;
    }
    else {
      if (DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll ==
          '\x01') {
        fVar10 = this->m_MouseX;
        in_XMM1_Db.w = 0.0;
        if ((local_48.z <= fVar10) || (DoEditBox::s_ScrollStartX - fVar10 <= 10.0)) {
          in_XMM1_Da.z = local_48.z + local_40.z;
          if ((fVar10 <= in_XMM1_Da.z) || (fVar10 - DoEditBox::s_ScrollStartX <= 10.0))
          goto LAB_0018cbb4;
          local_90 = str_utf8_forward(str,local_90);
        }
        else {
          in_XMM1_Da = local_48;
          local_90 = str_utf8_rewind(str,local_90);
        }
        DoEditBox::s_ScrollStartX = this->m_MouseX;
        bVar8 = 1;
        goto LAB_0018cd72;
      }
      if ((this->m_MouseButtons & 1) != 0 && !bVar4) {
        DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll =
             '\0';
        DoEditBox::s_SelectionStartOffset = -1;
        this->m_ActiveItemValid = true;
        this->m_pActiveItem = (void *)0x0;
        this->m_pLastActiveItem = (void *)0x0;
      }
    }
LAB_0018cbb4:
    bVar8 = 0;
  }
LAB_0018cd72:
  if (-1 < DoEditBox::s_SelectionStartOffset) {
    iVar6 = CLineInput::OffsetFromDisplayToActual(pLineInput,local_90);
    CLineInput::SetCursorOffset(pLineInput,iVar6);
    iVar6 = CLineInput::OffsetFromDisplayToActual(pLineInput,DoEditBox::s_SelectionStartOffset);
    End = CLineInput::OffsetFromDisplayToActual(pLineInput,local_90);
    CLineInput::SetSelection(pLineInput,iVar6,End);
  }
LAB_0018cdc3:
  if ((CLineInput *)this->m_pActiveItem == pLineInput) {
    this->m_ActiveItemValid = true;
    if ((this->m_MouseButtons & 1) == 0) {
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\0'
      ;
      DoEditBox::s_SelectionStartOffset = -1;
      this->m_ActiveItemValid = true;
      this->m_pActiveItem = (void *)0x0;
    }
  }
  else if (((CLineInput *)this->m_pHotItem == pLineInput) && ((this->m_MouseButtons & 1) != 0)) {
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pLineInput;
    if (pLineInput != (CLineInput *)0x0) {
      this->m_pLastActiveItem = pLineInput;
    }
  }
  if (bVar4) {
    this->m_pBecommingHotItem = pLineInput;
  }
  if ((bVar8 | bVar1) == 1 && pCVar2 == pLineInput) {
    pIVar3 = this->m_pTextRender;
    uVar7 = CLineInput::OffsetFromActualToDisplay(pLineInput,pLineInput->m_CursorPos);
    (*(pIVar3->super_IInterface)._vptr_IInterface[6])(FontSize,pIVar3,str,(ulong)uVar7);
    in_XMM1_Da.z = extraout_XMM0_Da_00 - aVar11.z;
    if (local_40.z < in_XMM1_Da.z) {
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                (FontSize,this->m_pTextRender,str,0xffffffff);
      in_XMM1_Db.w = 0.0;
      do {
        fVar10 = (extraout_XMM0_Da_01 - aVar11.z) - local_40.z;
        if (local_40.z / 3.0 <= fVar10) {
          fVar10 = local_40.z / 3.0;
        }
        aVar11.z = aVar11.z + fVar10;
        in_XMM1_Da = local_40;
      } while (local_40.z < extraout_XMM0_Da_00 - aVar11.z);
    }
    else {
      in_XMM1_Db = extraout_XMM0_Db_00;
      if (in_XMM1_Da.z < 0.0) {
        do {
          aVar9.z = aVar11.z - local_40.z / 3.0;
          in_XMM1_Db.w = 0.0;
          aVar11.z = 0.0;
          if (0.0 <= aVar9.z) {
            aVar11.z = aVar9.z;
          }
          in_XMM1_Da = aVar11;
        } while (extraout_XMM0_Da_00 < aVar11.z);
      }
    }
  }
  pLineInput->m_ScrollOffset = (float)aVar11;
  if ((pCVar2 == pLineInput) && (this->m_Enabled != false)) {
    CLineInput::Activate(pLineInput,UI);
  }
  else {
    CLineInput::Deactivate(pLineInput);
  }
  local_58._0_8_ =
       (*(code *)**(undefined8 **)pColorFunction)(pColorFunction,pCVar2 == pLineInput,bVar4);
  local_58.field_2 = in_XMM1_Da;
  local_58.field_3 = in_XMM1_Db;
  CUIRect::Draw(pRect,&local_58,5.0,Corners);
  ClipEnable(this,pRect);
  local_48.z = local_48.z - aVar11.z;
  (pLineInput->m_TextCursor).m_CursorPos.field_0.x = (float)local_48;
  (pLineInput->m_TextCursor).m_CursorPos.field_1.y = local_3c * 0.5 + local_44;
  CLineInput::Render(pLineInput);
  ClipDisable(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CUI::DoEditBox(CLineInput *pLineInput, const CUIRect *pRect, float FontSize, int Corners, const IButtonColorFunction *pColorFunction)
{
	CTextCursor *pCursor = pLineInput->GetCursor();
	pCursor->m_FontSize = FontSize;
	pCursor->m_Align = TEXTALIGN_ML;

	const bool Inside = MouseHovered(pRect);
	const bool Active = LastActiveItem() == pLineInput;
	const bool Changed = pLineInput->WasChanged();
	const char *pDisplayStr = pLineInput->GetDisplayedString();

	bool UpdateOffset = false;
	float ScrollOffset = pLineInput->GetScrollOffset();

	static bool s_DoScroll = false;
	static int s_SelectionStartOffset = -1;

	const float VSpacing = 2.0f;
	CUIRect Textbox;
	pRect->VMargin(VSpacing, &Textbox);

	if(Active)
	{
		static float s_ScrollStartX = 0.0f;

		int CursorOffset = pLineInput->GetCursorOffset();

		if(Inside && MouseButton(0) && !Changed)
		{
			s_DoScroll = true;
			s_ScrollStartX = MouseX();
			const float MxRel = MouseX() - Textbox.x;
			float PreviousWidth = 0.0f;
			for(int i = 1, Offset = 0; i <= pLineInput->GetNumChars(); i++)
			{
				int PrevOffset = Offset;
				Offset = str_utf8_forward(pDisplayStr, Offset);
				const float TextWidth = TextRender()->TextWidth(FontSize, pDisplayStr, Offset);
				if(PreviousWidth + (TextWidth - PreviousWidth)/2.0f - ScrollOffset > MxRel)
				{
					CursorOffset = PrevOffset;
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
					break;
				}
				PreviousWidth = TextWidth;

				if(i == pLineInput->GetNumChars())
				{
					CursorOffset = pLineInput->GetLength();
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
				}
			}
		}
		else if(!MouseButton(0) || Changed)
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
		}
		else if(s_DoScroll)
		{
			// do scrolling
			if(MouseX() < Textbox.x && s_ScrollStartX-MouseX() > 10.0f)
			{
				CursorOffset = str_utf8_rewind(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
			else if(MouseX() > Textbox.x+Textbox.w && MouseX()-s_ScrollStartX > 10.0f)
			{
				CursorOffset = str_utf8_forward(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
		}
		else if(!Inside && MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
			ClearLastActiveItem();
		}

		if(s_SelectionStartOffset >= 0)
		{
			pLineInput->SetCursorOffset(pLineInput->OffsetFromDisplayToActual(CursorOffset));
			pLineInput->SetSelection(pLineInput->OffsetFromDisplayToActual(s_SelectionStartOffset), pLineInput->OffsetFromDisplayToActual(CursorOffset));
		}
	}

	bool JustGotActive = false;

	if(CheckActiveItem(pLineInput))
	{
		if(!MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
		}
	}
	else if(HotItem() == pLineInput)
	{
		if(MouseButton(0))
		{
			if(!Active)
				JustGotActive = true;
			SetActiveItem(pLineInput);
		}
	}

	if(Inside)
		SetHotItem(pLineInput);

	// check if the text has to be moved
	if(Active && !JustGotActive && (UpdateOffset || Changed))
	{
		float w = TextRender()->TextWidth(FontSize, pDisplayStr, pLineInput->OffsetFromActualToDisplay(pLineInput->GetCursorOffset()));
		if(w-ScrollOffset > Textbox.w)
		{
			// move to the left
			float wt = TextRender()->TextWidth(FontSize, pDisplayStr, -1);
			do
			{
				ScrollOffset += minimum(wt-ScrollOffset-Textbox.w, Textbox.w/3);
			}
			while(w-ScrollOffset > Textbox.w);
		}
		else if(w-ScrollOffset < 0.0f)
		{
			// move to the right
			do
			{
				ScrollOffset = maximum(0.0f, ScrollOffset-Textbox.w/3);
			}
			while(w-ScrollOffset < 0.0f);
		}
	}

	pLineInput->SetScrollOffset(ScrollOffset);
	if(Enabled() && Active && !JustGotActive)
		pLineInput->Activate(UI);
	else
		pLineInput->Deactivate();

	// render
	pRect->Draw(pColorFunction->GetColor(Active, Inside), 5.0f, Corners);
	ClipEnable(pRect);
	Textbox.x -= ScrollOffset;
	pCursor->MoveTo(Textbox.x, Textbox.y + Textbox.h/2.0f);
	pLineInput->Render();
	ClipDisable();

	return Changed;
}